

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

package * lsvm::object::get_package(symbol *name)

{
  bool bVar1;
  void *in_RDI;
  package *pkg;
  package *local_18;
  
  local_18 = packages;
  do {
    bVar1 = symbol::symbol_equals(local_18->name,in_RDI);
    if (bVar1) {
      return local_18;
    }
    local_18 = local_18->next;
  } while (local_18 != (package_t *)0x0);
  return (package *)0x0;
}

Assistant:

package* get_package(symbol* name){
    package* pkg = packages;
    do{
        if(lsvm::symbol::symbol_equals(pkg->name,name)){
            return pkg;
        }
        pkg = pkg->next;
    }while(pkg != null);

    return null;
}